

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_ns.c
# Opt level: O0

ENCODING * findEncoding(ENCODING *enc,char *ptr,char *end)

{
  int iVar1;
  char **ppcStack_b0;
  int i;
  char *p;
  char buf [128];
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  ppcStack_b0 = &p;
  buf._120_8_ = end;
  end_local = ptr;
  ptr_local = (char *)enc;
  (*enc->utf8Convert)(enc,&end_local,end,(char **)&stack0xffffffffffffff50,buf + 0x77);
  if (end_local == (char *)buf._120_8_) {
    *(undefined1 *)ppcStack_b0 = 0;
    iVar1 = streqci((char *)&p,"UTF-16");
    if ((iVar1 == 0) || (*(int *)(ptr_local + 0x80) != 2)) {
      iVar1 = getEncodingIndex((char *)&p);
      if (iVar1 == -1) {
        enc_local = (ENCODING *)0x0;
      }
      else {
        enc_local = encodings[iVar1];
      }
    }
    else {
      enc_local = (ENCODING *)ptr_local;
    }
  }
  else {
    enc_local = (ENCODING *)0x0;
  }
  return enc_local;
}

Assistant:

static const ENCODING *
NS(findEncoding)(const ENCODING *enc, const char *ptr, const char *end)
{
#define ENCODING_MAX 128
  char buf[ENCODING_MAX];
  char *p = buf;
  int i;
  XmlUtf8Convert(enc, &ptr, end, &p, p + ENCODING_MAX - 1);
  if (ptr != end)
    return 0;
  *p = 0;
  if (streqci(buf, KW_UTF_16) && enc->minBytesPerChar == 2)
    return enc;
  i = getEncodingIndex(buf);
  if (i == UNKNOWN_ENC)
    return 0;
  return NS(encodings)[i];
}